

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_log.h
# Opt level: O0

uint32_t brotli::Log2FloorNonZero(size_t n)

{
  uint32_t uVar1;
  size_t n_local;
  
  uVar1 = 0x1f;
  if ((uint)n != 0) {
    for (; (uint)n >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return uVar1;
}

Assistant:

static inline uint32_t Log2FloorNonZero(size_t n) {
#ifdef __GNUC__
  return 31u ^ static_cast<uint32_t>(__builtin_clz(static_cast<uint32_t>(n)));
#else
  uint32_t result = 0;
  while (n >>= 1) result++;
  return result;
#endif
}